

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

void LogPrintf_<char[18],std::__cxx11::string,int,double,std::__cxx11::string>
               (string_view logging_function,string_view source_file,int source_line,LogFlags flag,
               Level level,char *fmt,char (*args) [18],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,int *args_2
               ,double *args_3,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4)

{
  bool bVar1;
  Logger *pLVar2;
  long in_FS_OFFSET;
  string_view str;
  undefined4 in_stack_0000000c;
  string log_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar2 = LogInstance();
  bVar1 = BCLog::Logger::Enabled(pLVar2);
  if (bVar1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    tinyformat::format<char[18],std::__cxx11::string,int,double,std::__cxx11::string>
              (&local_78,(tinyformat *)flag,"InvalidChainFound",
               (char (*) [18])CONCAT44(in_stack_0000000c,level),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fmt,(int *)args,
               (double *)args_1,in_stack_fffffffffffffef0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    pLVar2 = LogInstance();
    str._M_str = local_58._M_dataplus._M_p;
    str._M_len = local_58._M_string_length;
    BCLog::Logger::LogPrintStr(pLVar2,str,logging_function,source_file,source_line,ALL,Info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,
                      CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                               local_58.field_2._M_local_buf[0]) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void LogPrintf_(std::string_view logging_function, std::string_view source_file, const int source_line, const BCLog::LogFlags flag, const BCLog::Level level, const char* fmt, const Args&... args)
{
    if (LogInstance().Enabled()) {
        std::string log_msg;
        try {
            log_msg = tfm::format(fmt, args...);
        } catch (tinyformat::format_error& fmterr) {
            /* Original format string will have newline so don't add one here */
            log_msg = "Error \"" + std::string(fmterr.what()) + "\" while formatting log message: " + fmt;
        }
        LogInstance().LogPrintStr(log_msg, logging_function, source_file, source_line, flag, level);
    }
}